

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::Prettify(char *buffer,int length,int k,int maxDecimalPlaces)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int i_3;
  int i_2;
  int offset;
  int i_1;
  int i;
  int kk;
  int maxDecimalPlaces_local;
  int k_local;
  int length_local;
  char *buffer_local;
  
  iVar1 = length + k;
  if ((k < 0) || (offset = length, 0x15 < iVar1)) {
    if ((iVar1 < 1) || (0x15 < iVar1)) {
      if ((iVar1 < -5) || (0 < iVar1)) {
        if (SBORROW4(iVar1,-maxDecimalPlaces) == iVar1 + maxDecimalPlaces < 0) {
          if (length == 1) {
            buffer[1] = 'e';
            buffer_local = WriteExponent(iVar1 + -1,buffer + 2);
          }
          else {
            memmove(buffer + 2,buffer + 1,(long)(length + -1));
            buffer[1] = '.';
            buffer[length + 1] = 'e';
            buffer_local = WriteExponent(iVar1 + -1,buffer + (length + 2));
          }
        }
        else {
          *buffer = '0';
          buffer[1] = '.';
          buffer[2] = '0';
          buffer_local = buffer + 3;
        }
      }
      else {
        iVar2 = 2 - iVar1;
        memmove(buffer + iVar2,buffer,(long)length);
        *buffer = '0';
        buffer[1] = '.';
        for (local_38 = 2; local_38 < iVar2; local_38 = local_38 + 1) {
          buffer[local_38] = '0';
        }
        if (maxDecimalPlaces < length - iVar1) {
          for (local_3c = maxDecimalPlaces + 1; 2 < local_3c; local_3c = local_3c + -1) {
            if (buffer[local_3c] != '0') {
              return buffer + (local_3c + 1);
            }
          }
          buffer_local = buffer + 3;
        }
        else {
          buffer_local = buffer + (length + iVar2);
        }
      }
    }
    else {
      memmove(buffer + (iVar1 + 1),buffer + iVar1,(long)(length - iVar1));
      buffer[iVar1] = '.';
      if (k + maxDecimalPlaces < 0) {
        for (i_2 = iVar1 + maxDecimalPlaces; iVar1 + 1 < i_2; i_2 = i_2 + -1) {
          if (buffer[i_2] != '0') {
            return buffer + (i_2 + 1);
          }
        }
        buffer_local = buffer + (iVar1 + 2);
      }
      else {
        buffer_local = buffer + (length + 1);
      }
    }
  }
  else {
    for (; offset < iVar1; offset = offset + 1) {
      buffer[offset] = '0';
    }
    buffer[iVar1] = '.';
    buffer[iVar1 + 1] = '0';
    buffer_local = buffer + (iVar1 + 2);
  }
  return buffer_local;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k, int maxDecimalPlaces) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (0 <= k && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], static_cast<size_t>(length - kk));
        buffer[kk] = '.';
        if (0 > k + maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 1.2345 -> 1.23, 1.102 -> 1.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = kk + maxDecimalPlaces; i > kk + 1; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[kk + 2]; // Reserve one zero
        }
        else
            return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], static_cast<size_t>(length));
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        if (length - kk > maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 0.123 -> 0.12, 0.102 -> 0.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = maxDecimalPlaces + 1; i > 2; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[3]; // Reserve one zero
        }
        else
            return &buffer[length + offset];
    }
    else if (kk < -maxDecimalPlaces) {
        // Truncate to zero
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], static_cast<size_t>(length - 1));
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}